

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_ls.c
# Opt level: O1

int arkLSGetNumPrecEvals(void *arkode_mem,long *npevals)

{
  int iVar1;
  ARKLsMem arkls_mem;
  ARKodeMem ark_mem;
  ARKLsMem local_18;
  ARKodeMem local_10;
  
  iVar1 = arkLs_AccessLMem(arkode_mem,"arkLSGetNumPrecEvals",&local_10,&local_18);
  if (iVar1 == 0) {
    *npevals = local_18->npe;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int arkLSGetNumPrecEvals(void *arkode_mem, long int *npevals)
{
  ARKodeMem ark_mem;
  ARKLsMem  arkls_mem;
  int       retval;

  /* access ARKLsMem structure; set output value and return */
  retval = arkLs_AccessLMem(arkode_mem, "arkLSGetNumPrecEvals",
                            &ark_mem, &arkls_mem);
  if (retval != ARK_SUCCESS)  return(retval);
  *npevals = arkls_mem->npe;
  return(ARKLS_SUCCESS);
}